

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

QByteArray * __thiscall
QByteArray::replace(QByteArray *this,QByteArrayView before,QByteArrayView after)

{
  QByteArrayMatcher *pQVar1;
  bool bVar2;
  const_pointer pvVar3;
  size_t sVar4;
  size_t __n;
  char *pcVar5;
  qsizetype qVar6;
  QByteArrayMatcher *pQVar7;
  size_t __n_00;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  QArrayDataPointer<char> *in_RDI;
  long in_FS_OFFSET;
  qsizetype moveto;
  qsizetype insertstart;
  qsizetype movestart_1;
  qsizetype moveend;
  qsizetype newlen;
  qsizetype adjust;
  size_t pos;
  qsizetype msize_1;
  qsizetype msize;
  size_t num;
  size_t movestart;
  size_t to;
  char *d;
  qsizetype len;
  qsizetype index;
  qsizetype asize;
  qsizetype bsize;
  char *a;
  char *b;
  size_t indices [4096];
  QByteArrayMatcher matcher;
  string pinnedReplacement;
  string pinnedNeedle;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffff7a80;
  char *in_stack_ffffffffffff7a88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffff7a90;
  QByteArrayMatcher *in_stack_ffffffffffff7a98;
  qsizetype in_stack_ffffffffffff7aa0;
  QArrayDataPointer<char> *in_stack_ffffffffffff7aa8;
  char **in_stack_ffffffffffff7ab0;
  QByteArray *in_stack_ffffffffffff7ad8;
  ulong local_8510;
  undefined8 in_stack_ffffffffffff7af8;
  undefined2 uVar12;
  long local_84f8;
  long local_84f0;
  QByteArrayMatcher *local_84e8;
  long local_84d8;
  long local_84d0;
  QArrayDataPointer<char> *local_84a0;
  const_pointer local_8498;
  QByteArrayView local_8488;
  QByteArrayView local_8478;
  qsizetype local_8468 [4096];
  QByteArrayMatcher local_468;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  uVar12 = (undefined2)((ulong)in_stack_ffffffffffff7af8 >> 0x30);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar3 = QByteArrayView::data(&local_8478);
  sVar4 = QByteArrayView::size(&local_8478);
  local_8498 = QByteArrayView::data(&local_8488);
  __n = QByteArrayView::size(&local_8488);
  bVar2 = isEmpty((QByteArray *)0x4b4faf);
  local_84a0 = in_RDI;
  if (bVar2) {
    if (sVar4 != 0) goto LAB_004b57e6;
  }
  else if ((pvVar3 == local_8498) && (sVar4 == __n)) goto LAB_004b57e6;
  if ((__n != 0) || (sVar4 != 0)) {
    if ((sVar4 == 1) && (__n == 1)) {
      local_84a0 = &replace(in_stack_ffffffffffff7ad8,(char)((ushort)uVar12 >> 8),(char)uVar12)->d;
    }
    else {
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      std::__cxx11::string::string(in_stack_ffffffffffff7a90);
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      std::__cxx11::string::string(in_stack_ffffffffffff7a90);
      bVar2 = QtPrivate::q_points_into_range<QArrayDataPointer<char>,char_const*>
                        (in_stack_ffffffffffff7ab0,in_stack_ffffffffffff7aa8);
      if (bVar2) {
        std::__cxx11::string::assign<char_const*,void>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffff7a98,(char *)in_stack_ffffffffffff7a90,
                   in_stack_ffffffffffff7a88);
        local_8498 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::data((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            0x4b5155);
      }
      bVar2 = QtPrivate::q_points_into_range<QArrayDataPointer<char>,char_const*>
                        (in_stack_ffffffffffff7ab0,in_stack_ffffffffffff7aa8);
      if (bVar2) {
        std::__cxx11::string::assign<char_const*,void>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffff7a98,(char *)in_stack_ffffffffffff7a90,
                   in_stack_ffffffffffff7a88);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4b51c6);
      }
      pQVar7 = &local_468;
      memset(pQVar7,0xaa,0x420);
      QByteArrayMatcher::QByteArrayMatcher
                (pQVar7,(char *)in_stack_ffffffffffff7aa8,in_stack_ffffffffffff7aa0);
      local_84d0 = 0;
      local_84d8 = size((QByteArray *)in_RDI);
      pcVar5 = data((QByteArray *)in_stack_ffffffffffff7a80);
      if (sVar4 == __n) {
        if (sVar4 != 0) {
          while (qVar6 = QByteArrayMatcher::indexIn<void>
                                   (in_stack_ffffffffffff7a98,
                                    (QByteArray *)in_stack_ffffffffffff7a90,
                                    (qsizetype)in_stack_ffffffffffff7a88), qVar6 != -1) {
            memcpy(pcVar5 + qVar6,local_8498,__n);
          }
        }
      }
      else if ((long)__n < (long)sVar4) {
        local_84e8 = (QByteArrayMatcher *)0x0;
        local_84f0 = 0;
        local_84f8 = 0;
        while (pQVar7 = (QByteArrayMatcher *)
                        QByteArrayMatcher::indexIn<void>
                                  (in_stack_ffffffffffff7a98,(QByteArray *)in_stack_ffffffffffff7a90
                                   ,(qsizetype)in_stack_ffffffffffff7a88),
              pQVar7 != (QByteArrayMatcher *)0xffffffffffffffff) {
          in_stack_ffffffffffff7a98 = pQVar7;
          pQVar1 = pQVar7;
          if ((local_84f8 != 0) &&
             (__n_00 = (long)pQVar7 - local_84f0, pQVar1 = local_84e8, 0 < (long)__n_00)) {
            memmove(pcVar5 + (long)local_84e8,pcVar5 + local_84f0,__n_00);
            pQVar1 = (QByteArrayMatcher *)(__n_00 + (long)local_84e8);
          }
          local_84e8 = pQVar1;
          if (0 < (long)__n) {
            memcpy(pcVar5 + (long)local_84e8,local_8498,__n);
            local_84e8 = (QByteArrayMatcher *)((long)&local_84e8->d + __n);
          }
          local_84f0 = (long)&pQVar7->d + sVar4;
          local_84f8 = local_84f8 + 1;
        }
        if (local_84f8 != 0) {
          if (0 < local_84d8 - local_84f0) {
            memmove(pcVar5 + (long)local_84e8,pcVar5 + local_84f0,local_84d8 - local_84f0);
          }
          resize((QByteArray *)in_stack_ffffffffffff7a90,(qsizetype)in_stack_ffffffffffff7a88);
        }
      }
      else {
        while (local_84d0 != -1) {
          memset(local_8468,0xaa,0x8000);
          local_8510 = 0;
          while (local_8510 < 0xfff) {
            in_stack_ffffffffffff7a90 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 QByteArrayMatcher::indexIn<void>
                           (in_stack_ffffffffffff7a98,(QByteArray *)in_stack_ffffffffffff7a90,
                            (qsizetype)in_stack_ffffffffffff7a88);
            if (in_stack_ffffffffffff7a90 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                0xffffffffffffffff) {
              local_84d0 = -1;
              break;
            }
            uVar11 = local_8510 + 1;
            local_8468[local_8510] = (qsizetype)in_stack_ffffffffffff7a90;
            local_84d0 = (long)&(in_stack_ffffffffffff7a90->_M_dataplus)._M_p + sVar4;
            local_8510 = uVar11;
            if (sVar4 == 0) {
              local_84d0 = local_84d0 + 1;
            }
          }
          if (local_8510 == 0) break;
          lVar8 = local_8510 * (__n - sVar4);
          if (local_84d0 != -1) {
            local_84d0 = lVar8 + local_84d0;
          }
          lVar8 = local_84d8 + lVar8;
          lVar10 = local_84d8;
          if (local_84d8 < lVar8) {
            resize((QByteArray *)in_stack_ffffffffffff7a90,(qsizetype)in_stack_ffffffffffff7a88);
            lVar10 = local_84d8;
            local_84d8 = lVar8;
          }
          pcVar5 = QArrayDataPointer<char>::data(in_RDI);
          while (local_8510 != 0) {
            local_8510 = local_8510 - 1;
            lVar8 = local_8468[local_8510] + sVar4;
            lVar9 = local_8468[local_8510] + local_8510 * (__n - sVar4);
            memmove(pcVar5 + lVar9 + __n,pcVar5 + lVar8,lVar10 - lVar8);
            if (__n != 0) {
              memcpy(pcVar5 + lVar9,local_8498,__n);
            }
            lVar10 = lVar8 - sVar4;
          }
        }
      }
      QByteArrayMatcher::~QByteArrayMatcher((QByteArrayMatcher *)0x4b57ae);
      std::__cxx11::string::~string(in_stack_ffffffffffff7a80);
      std::__cxx11::string::~string(in_stack_ffffffffffff7a80);
    }
  }
LAB_004b57e6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QByteArray *)local_84a0;
}

Assistant:

QByteArray &QByteArray::replace(QByteArrayView before, QByteArrayView after)
{
    const char *b = before.data();
    qsizetype bsize = before.size();
    const char *a = after.data();
    qsizetype asize = after.size();

    if (isEmpty()) {
        if (bsize)
            return *this;
    } else {
        if (b == a && bsize == asize)
            return *this;
    }
    if (asize == 0 && bsize == 0)
        return *this;

    if (bsize == 1 && asize == 1)
        return replace(*b, *a); // use the fast char-char algorithm

    // protect against before or after being part of this
    std::string pinnedNeedle, pinnedReplacement;
    if (QtPrivate::q_points_into_range(a, d)) {
        pinnedReplacement.assign(a, a + asize);
        a = pinnedReplacement.data();
    }
    if (QtPrivate::q_points_into_range(b, d)) {
        pinnedNeedle.assign(b, b + bsize);
        b = pinnedNeedle.data();
    }

    QByteArrayMatcher matcher(b, bsize);
    qsizetype index = 0;
    qsizetype len = size();
    char *d = data(); // detaches

    if (bsize == asize) {
        if (bsize) {
            while ((index = matcher.indexIn(*this, index)) != -1) {
                memcpy(d + index, a, asize);
                index += bsize;
            }
        }
    } else if (asize < bsize) {
        size_t to = 0;
        size_t movestart = 0;
        size_t num = 0;
        while ((index = matcher.indexIn(*this, index)) != -1) {
            if (num) {
                qsizetype msize = index - movestart;
                if (msize > 0) {
                    memmove(d + to, d + movestart, msize);
                    to += msize;
                }
            } else {
                to = index;
            }
            if (asize > 0) {
                memcpy(d + to, a, asize);
                to += asize;
            }
            index += bsize;
            movestart = index;
            num++;
        }
        if (num) {
            qsizetype msize = len - movestart;
            if (msize > 0)
                memmove(d + to, d + movestart, msize);
            resize(len - num*(bsize-asize));
        }
    } else {
        // the most complex case. We don't want to lose performance by doing repeated
        // copies and reallocs of the data.
        while (index != -1) {
            size_t indices[4096];
            size_t pos = 0;
            while(pos < 4095) {
                index = matcher.indexIn(*this, index);
                if (index == -1)
                    break;
                indices[pos++] = index;
                index += bsize;
                // avoid infinite loop
                if (!bsize)
                    index++;
            }
            if (!pos)
                break;

            // we have a table of replacement positions, use them for fast replacing
            qsizetype adjust = pos*(asize-bsize);
            // index has to be adjusted in case we get back into the loop above.
            if (index != -1)
                index += adjust;
            qsizetype newlen = len + adjust;
            qsizetype moveend = len;
            if (newlen > len) {
                resize(newlen);
                len = newlen;
            }
            d = this->d.data(); // data(), without the detach() check

            while(pos) {
                pos--;
                qsizetype movestart = indices[pos] + bsize;
                qsizetype insertstart = indices[pos] + pos*(asize-bsize);
                qsizetype moveto = insertstart + asize;
                memmove(d + moveto, d + movestart, (moveend - movestart));
                if (asize)
                    memcpy(d + insertstart, a, asize);
                moveend = movestart - bsize;
            }
        }
    }
    return *this;
}